

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O1

void pbrt::detail::
     stringPrintfRecursive<std::map<std::__cxx11::string,pbrt::TransformedSceneEntity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pbrt::TransformedSceneEntity>>>const&,std::vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>const&,std::vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>const&,std::map<std::__cxx11::string,pbrt::InstanceDefinitionSceneEntity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pbrt::InstanceDefinitionSceneEntity>>>const&,std::vector<pbrt::LightSceneEntity,std::allocator<pbrt::LightSceneEntity>>const&,std::vector<pbrt::ShapeSceneEntity,std::allocator<pbrt::ShapeSceneEntity>>const&,std::vector<pbrt::InstanceSceneEntity,std::allocator<pbrt::InstanceSceneEntity>>const&>
               (string *s,char *fmt,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
               *v,vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                  *args,vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                        *args_1,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
               *args_2,vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>
                       *args_3,
               vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *args_4,
               vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_> *args_5
               )

{
  _Alloc_hider _Var1;
  _Alloc_hider __format;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  _Base_ptr p_Var6;
  char *s_00;
  char cVar7;
  _Rb_tree_header *p_Var8;
  string ret;
  string s_1;
  string nextFmt;
  char *fmt_local;
  stringstream ss;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  fmt_local = fmt;
  copyToFormatString(&nextFmt,&fmt_local,s);
  cVar7 = (char)&nextFmt;
  lVar3 = std::__cxx11::string::find(cVar7,0x2a);
  lVar4 = std::__cxx11::string::find(cVar7,0x73);
  lVar5 = std::__cxx11::string::find(cVar7,100);
  if (lVar3 == -1) {
    if (lVar5 == -1) {
      if (lVar4 != -1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        s_1._M_dataplus._M_p = (pointer)&s_1.field_2;
        s_1.field_2._M_allocated_capacity._0_2_ = 0x205b;
        s_1._M_string_length = 2;
        s_1.field_2._M_local_buf[2] = '\0';
        p_Var6 = (v->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var8 = &(v->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var6 != p_Var8) {
          do {
            ret._M_string_length = 0;
            ret.field_2._M_local_buf[0] = '\0';
            ret._M_dataplus._M_p = (pointer)&ret.field_2;
            stringPrintfRecursive<std::__cxx11::string_const&,pbrt::TransformedSceneEntity_const&>
                      (&ret,"%s:%s ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var6 + 1),(TransformedSceneEntity *)(p_Var6 + 2));
            std::__cxx11::string::_M_append((char *)&s_1,(ulong)ret._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)ret._M_dataplus._M_p != &ret.field_2) {
              operator_delete(ret._M_dataplus._M_p,
                              CONCAT71(ret.field_2._M_allocated_capacity._1_7_,
                                       ret.field_2._M_local_buf[0]) + 1);
            }
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
          } while ((_Rb_tree_header *)p_Var6 != p_Var8);
        }
        std::__cxx11::string::append((char *)&s_1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,s_1._M_dataplus._M_p,s_1._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)s_1._M_dataplus._M_p != &s_1.field_2) {
          operator_delete(s_1._M_dataplus._M_p,
                          CONCAT53(s_1.field_2._M_allocated_capacity._3_5_,
                                   CONCAT12(s_1.field_2._M_local_buf[2],
                                            s_1.field_2._M_allocated_capacity._0_2_)) + 1);
        }
        __format._M_p = nextFmt._M_dataplus._M_p;
        std::__cxx11::stringbuf::str();
        _Var1 = s_1._M_dataplus;
        iVar2 = snprintf((char *)0x0,0,__format._M_p,s_1._M_dataplus._M_p);
        ret._M_string_length = 0;
        ret.field_2._M_local_buf[0] = '\0';
        ret._M_dataplus._M_p = (pointer)&ret.field_2;
        std::__cxx11::string::resize((ulong)&ret,(char)(iVar2 + 1));
        snprintf(ret._M_dataplus._M_p,(long)(iVar2 + 1),__format._M_p,_Var1._M_p);
        std::__cxx11::string::pop_back();
        std::__cxx11::string::_M_append((char *)s,(ulong)ret._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ret._M_dataplus._M_p != &ret.field_2) {
          operator_delete(ret._M_dataplus._M_p,
                          CONCAT71(ret.field_2._M_allocated_capacity._1_7_,
                                   ret.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)s_1._M_dataplus._M_p != &s_1.field_2) {
          operator_delete(s_1._M_dataplus._M_p,
                          CONCAT53(s_1.field_2._M_allocated_capacity._3_5_,
                                   CONCAT12(s_1.field_2._M_local_buf[2],
                                            s_1.field_2._M_allocated_capacity._0_2_)) + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_138);
        stringPrintfRecursive<std::vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>const&,std::vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>const&,std::map<std::__cxx11::string,pbrt::InstanceDefinitionSceneEntity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pbrt::InstanceDefinitionSceneEntity>>>const&,std::vector<pbrt::LightSceneEntity,std::allocator<pbrt::LightSceneEntity>>const&,std::vector<pbrt::ShapeSceneEntity,std::allocator<pbrt::ShapeSceneEntity>>const&,std::vector<pbrt::InstanceSceneEntity,std::allocator<pbrt::InstanceSceneEntity>>const&>
                  (s,fmt_local,args,args_1,args_2,args_3,args_4,args_5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)nextFmt._M_dataplus._M_p != &nextFmt.field_2) {
          operator_delete(nextFmt._M_dataplus._M_p,nextFmt.field_2._M_allocated_capacity + 1);
        }
        return;
      }
      if (nextFmt._M_string_length != 0) {
        _ss = nextFmt._M_dataplus._M_p;
        ret._M_dataplus._M_p =
             "St3mapINSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEN4pbrt22TransformedSceneEntityESt4lessIS5_ESaISt4pairIKS5_S7_EEE"
        ;
        LogFatal<char_const*,char_const*&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print.h"
                   ,0xb2,"Printf: Non-basic type %s passed for format string %s",(char **)&ret,
                   (char **)&ss);
      }
      s_00 = "Excess values passed to Printf.";
      iVar2 = 0x10d;
    }
    else {
      s_00 = "Non-integral type passed to %d format.";
      iVar2 = 0x104;
    }
  }
  else {
    s_00 = "Non-integral type provided for %* format.";
    iVar2 = 0xe8;
  }
  LogFatal(Fatal,
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print.h"
           ,iVar2,s_00);
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}